

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  size_type __n;
  ostream *poVar1;
  int i;
  uint32_t uVar2;
  vector<char,_std::allocator<char>_> code;
  vector<char,_std::allocator<char>_> stack;
  PowerCore core;
  ifstream in;
  
  std::ifstream::ifstream(&in,"testfun.bin",_S_in);
  std::istream::seekg((long)&in,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg(&in,0,0);
  std::vector<char,_std::allocator<char>_>::vector(&code,__n,(allocator_type *)&core);
  std::istream::read((char *)&in,
                     (long)code.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::vector<char,_std::allocator<char>_>::vector(&stack,0x100000,(allocator_type *)&core);
  memset(&core,0,0x193);
  core.memoryBases[2] = (void *)0x0;
  core.memoryBases[3] = (void *)0x0;
  core.blocks._M_h._M_buckets = &core.blocks._M_h._M_single_bucket;
  core.syscall = (_func_uint32_t_PowerCore_ptr *)0x0;
  core.handleInterrupt = (_func_void_PowerCore_ptr *)0x0;
  core.debugger = (_func_void_PowerCore_ptr *)0x0;
  core.getNextBreakpoint = (_func_uint32_t_uint32_t *)0x0;
  core.blocks._M_h._M_bucket_count = 1;
  core.blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  core.blocks._M_h._M_element_count = 0;
  core.blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  core.blocks._M_h._M_rehash_policy._M_next_resize = 0;
  core.blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  core.memoryBases[0] =
       code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  ;
  core.memoryBases[1] =
       stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start + -0x40000000;
  core.super_PowerCoreState.r[1] = 0x400ffc00;
  for (uVar2 = 0; uVar2 != 0xf; uVar2 = uVar2 + 1) {
    core.super_PowerCoreState.r[3] = uVar2;
    poVar1 = std::operator<<((ostream *)&std::cout,"in: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    core.super_PowerCoreState.CIA = 0;
    core.super_PowerCoreState.lr = 0xfffffffc;
    PowerCore::execute(&core);
    poVar1 = std::operator<<((ostream *)&std::cout,"out: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&core.blocks._M_h);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&stack.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&code.super__Vector_base<char,_std::allocator<char>_>);
  std::ifstream::~ifstream(&in);
  return 0;
}

Assistant:

int main()
{
    std::ifstream in("testfun.bin");
    in.seekg(0, std::ios::end);
    size_t sz = in.tellg();
    in.seekg(0);

    std::vector<char> code(sz);
    in.read(code.data(),sz);

    std::vector<char> stack(1024 * 1024);

    PowerCore core;

    core.memoryBases[0] = code.data();
    core.memoryBases[1] = stack.data() - 0x40000000;
    core.r[1] = 0x40000000 + 1024 * 1024 - 1024;

    for(int i = 0; i < 15; i++)
    {
        core.r[3] = i;
        std::cout << "in: " << std::dec << core.r[3] << std::endl;
        
        core.CIA = 0;
        core.lr = 0xFFFFFFFC;
        core.execute();

        std::cout << "out: " << std::dec << core.r[3] << std::endl;
    }

    return 0;
}